

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
* __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
::GetCurrentAction(TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
                   *this,FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
                         *mocker,ArgumentTuple *args)

{
  bool condition;
  size_type sVar1;
  ostream *poVar2;
  char *pcVar3;
  const_reference ppvVar4;
  Action<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *local_290;
  ostream *local_278;
  ostream *local_228;
  string local_208;
  stringstream local_1e8 [8];
  stringstream ss;
  ostream local_1d8 [376];
  int local_60;
  int action_count;
  allocator local_49;
  string local_48;
  int local_24;
  ArgumentTuple *pAStack_20;
  int count;
  ArgumentTuple *args_local;
  FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *mocker_local;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
  *this_local;
  
  pAStack_20 = args;
  args_local = (ArgumentTuple *)mocker;
  mocker_local = (FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
                  *)this;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_24 = ExpectationBase::call_count((ExpectationBase *)this);
  condition = 0 < local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "call_count() is <= 0 when GetCurrentAction() is called - this should never happen.",
             &local_49);
  Assert(condition,
         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-spec-builders.h"
         ,0x48e,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                    ((vector<const_void_*,_std::allocator<const_void_*>_> *)(this + 0x88));
  local_60 = (int)sVar1;
  if (((0 < local_60) && (((byte)this[0xa1] & 1) == 0)) && (local_60 < local_24)) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    local_228 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e8) {
      local_228 = local_1d8;
    }
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this,local_228);
    poVar2 = std::operator<<(local_1d8,"Actions ran out in ");
    pcVar3 = ExpectationBase::source_text((ExpectationBase *)this);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"...\n");
    poVar2 = std::operator<<(poVar2,"Called ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    poVar2 = std::operator<<(poVar2," times, but only ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2," WillOnce()");
    pcVar3 = "s are";
    if (local_60 == 1) {
      pcVar3 = " is";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2," specified - ");
    local_278 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e8) {
      local_278 = local_1d8;
    }
    FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
    ::DescribeDefaultActionTo
              ((FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
                *)args_local,pAStack_20,local_278);
    std::__cxx11::stringstream::str();
    Log(kWarning,&local_208,1);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream(local_1e8);
  }
  if (local_60 < local_24) {
    local_290 = repeated_action(this);
  }
  else {
    ppvVar4 = std::vector<const_void_*,_std::allocator<const_void_*>_>::operator[]
                        ((vector<const_void_*,_std::allocator<const_void_*>_> *)(this + 0x88),
                         (long)(local_24 + -1));
    local_290 = (Action<ot::commissioner::Error_(const_ot::commissioner::Channel_&,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>)>
                 *)*ppvVar4;
  }
  return local_290;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count
               ? *static_cast<const Action<F>*>(
                     untyped_actions_[static_cast<size_t>(count - 1)])
               : repeated_action();
  }